

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
         *this,size_t i)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  float fVar22;
  float fVar40;
  float fVar42;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar41;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  float fVar43;
  float fVar44;
  float fVar57;
  float fVar58;
  undefined1 auVar45 [16];
  float fVar59;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  float fVar74;
  float fVar78;
  float fVar82;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar90;
  float fVar91;
  __m128 a;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  float fVar96;
  float fVar100;
  float fVar101;
  vfloat4 b1;
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vfloat4 b0;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  vfloat4 b1_2;
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar119 [16];
  float fVar123;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar124 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices.
           items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar5->super_RawBufferView).stride;
  lVar18 = sVar7 * uVar4;
  lVar19 = sVar7 * (uVar4 + 1);
  lVar20 = sVar7 * (uVar4 + 2);
  lVar17 = sVar7 * (uVar4 + 3);
  fVar44 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.normals.
           items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar7 = (pBVar8->super_RawBufferView).stride;
  pfVar1 = (float *)(pcVar9 + uVar4 * sVar7);
  fVar64 = *pfVar1;
  fVar74 = pfVar1[1];
  fVar78 = pfVar1[2];
  fVar82 = pfVar1[3];
  pfVar1 = (float *)(pcVar9 + (uVar4 + 1) * sVar7);
  pfVar2 = (float *)(pcVar9 + (uVar4 + 2) * sVar7);
  pfVar3 = (float *)(pcVar9 + sVar7 * (uVar4 + 3));
  fVar90 = *pfVar3;
  fVar91 = pfVar3[1];
  fVar22 = pfVar3[2];
  fVar41 = pfVar3[3];
  auVar25 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar18),
                          ZEXT416((uint)(fVar44 * *(float *)(pcVar6 + lVar18 + 0xc))),0x30);
  auVar26 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar19),
                          ZEXT416((uint)(fVar44 * *(float *)(pcVar6 + lVar19 + 0xc))),0x30);
  auVar27 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar20),
                          ZEXT416((uint)(fVar44 * *(float *)(pcVar6 + lVar20 + 0xc))),0x30);
  fVar60 = auVar27._0_4_ * 0.0;
  fVar71 = auVar27._4_4_ * 0.0;
  fVar75 = auVar27._8_4_ * 0.0;
  fVar79 = auVar27._12_4_ * 0.0;
  auVar23 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar17),
                          ZEXT416((uint)(fVar44 * *(float *)(pcVar6 + lVar17 + 0xc))),0x30);
  fVar21 = auVar23._0_4_;
  fVar40 = auVar23._4_4_;
  fVar42 = auVar23._8_4_;
  fVar44 = auVar23._12_4_;
  fVar123 = fVar60 + fVar21 * 0.0;
  fVar125 = fVar71 + fVar40 * 0.0;
  fVar126 = fVar75 + fVar42 * 0.0;
  fVar127 = fVar79 + fVar44 * 0.0;
  auVar23._0_4_ = fVar123 + auVar26._0_4_ * 3.0;
  auVar23._4_4_ = fVar125 + auVar26._4_4_ * 3.0;
  auVar23._8_4_ = fVar126 + auVar26._8_4_ * 3.0;
  auVar23._12_4_ = fVar127 + auVar26._12_4_ * 3.0;
  fVar109 = auVar25._0_4_;
  auVar45._0_4_ = fVar109 * 3.0;
  fVar112 = auVar25._4_4_;
  auVar45._4_4_ = fVar112 * 3.0;
  fVar113 = auVar25._8_4_;
  auVar45._8_4_ = fVar113 * 3.0;
  fVar114 = auVar25._12_4_;
  auVar45._12_4_ = fVar114 * 3.0;
  auVar32 = vsubps_avx(auVar23,auVar45);
  fVar43 = *pfVar1 * 0.0;
  fVar57 = pfVar1[1] * 0.0;
  fVar58 = pfVar1[2] * 0.0;
  fVar59 = pfVar1[3] * 0.0;
  fVar61 = *pfVar2 * 0.0;
  fVar72 = pfVar2[1] * 0.0;
  fVar76 = pfVar2[2] * 0.0;
  fVar80 = pfVar2[3] * 0.0;
  fVar62 = fVar61 + fVar90 * 0.0;
  fVar73 = fVar72 + fVar91 * 0.0;
  fVar77 = fVar76 + fVar22 * 0.0;
  fVar81 = fVar80 + fVar41 * 0.0;
  auVar25._0_4_ = fVar64 + fVar43 + fVar62;
  auVar25._4_4_ = fVar74 + fVar57 + fVar73;
  auVar25._8_4_ = fVar78 + fVar58 + fVar77;
  auVar25._12_4_ = fVar82 + fVar59 + fVar81;
  auVar45 = vshufps_avx(auVar32,auVar32,0xc9);
  auVar83._0_4_ = auVar45._0_4_ * auVar25._0_4_;
  auVar83._4_4_ = auVar45._4_4_ * auVar25._4_4_;
  auVar83._8_4_ = auVar45._8_4_ * auVar25._8_4_;
  auVar83._12_4_ = auVar45._12_4_ * auVar25._12_4_;
  auVar25 = vshufps_avx(auVar25,auVar25,0xc9);
  fVar96 = auVar32._0_4_;
  auVar24._0_4_ = fVar96 * auVar25._0_4_;
  fVar100 = auVar32._4_4_;
  auVar24._4_4_ = fVar100 * auVar25._4_4_;
  fVar101 = auVar32._8_4_;
  auVar24._8_4_ = fVar101 * auVar25._8_4_;
  fVar102 = auVar32._12_4_;
  auVar24._12_4_ = fVar102 * auVar25._12_4_;
  auVar25 = vsubps_avx(auVar83,auVar24);
  auVar24 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar25 = vdpps_avx(auVar24,auVar24,0x7f);
  fVar63 = auVar25._0_4_;
  auVar84._4_12_ = ZEXT812(0) << 0x20;
  auVar84._0_4_ = fVar63;
  auVar23 = vrsqrtss_avx(auVar84,auVar84);
  fVar120 = auVar23._0_4_;
  auVar65._0_4_ = *pfVar1 * 3.0 + fVar62;
  auVar65._4_4_ = pfVar1[1] * 3.0 + fVar73;
  auVar65._8_4_ = pfVar1[2] * 3.0 + fVar77;
  auVar65._12_4_ = pfVar1[3] * 3.0 + fVar81;
  auVar117._0_4_ = fVar64 * 3.0;
  auVar117._4_4_ = fVar74 * 3.0;
  auVar117._8_4_ = fVar78 * 3.0;
  auVar117._12_4_ = fVar82 * 3.0;
  auVar23 = vsubps_avx(auVar65,auVar117);
  auVar46._0_4_ = auVar45._0_4_ * auVar23._0_4_;
  auVar46._4_4_ = auVar45._4_4_ * auVar23._4_4_;
  auVar46._8_4_ = auVar45._8_4_ * auVar23._8_4_;
  auVar46._12_4_ = auVar45._12_4_ * auVar23._12_4_;
  auVar23 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar66._0_4_ = fVar96 * auVar23._0_4_;
  auVar66._4_4_ = fVar100 * auVar23._4_4_;
  auVar66._8_4_ = fVar101 * auVar23._8_4_;
  auVar66._12_4_ = fVar102 * auVar23._12_4_;
  auVar23 = vsubps_avx(auVar46,auVar66);
  auVar45 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vdpps_avx(auVar24,auVar45,0x7f);
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  auVar47._0_4_ = auVar25._0_4_ * auVar45._0_4_;
  auVar47._4_4_ = auVar25._4_4_ * auVar45._4_4_;
  auVar47._8_4_ = auVar25._8_4_ * auVar45._8_4_;
  auVar47._12_4_ = auVar25._12_4_ * auVar45._12_4_;
  auVar25 = vshufps_avx(auVar23,auVar23,0);
  auVar67._0_4_ = auVar24._0_4_ * auVar25._0_4_;
  auVar67._4_4_ = auVar24._4_4_ * auVar25._4_4_;
  auVar67._8_4_ = auVar24._8_4_ * auVar25._8_4_;
  auVar67._12_4_ = auVar24._12_4_ * auVar25._12_4_;
  auVar28 = vsubps_avx(auVar47,auVar67);
  auVar25 = vrcpss_avx(auVar84,auVar84);
  auVar25 = ZEXT416((uint)(auVar25._0_4_ * (2.0 - fVar63 * auVar25._0_4_)));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  auVar23 = ZEXT416((uint)(fVar120 * 1.5 - fVar63 * 0.5 * fVar120 * fVar120 * fVar120));
  auVar23 = vshufps_avx(auVar23,auVar23,0);
  fVar63 = auVar24._0_4_ * auVar23._0_4_;
  fVar62 = auVar24._4_4_ * auVar23._4_4_;
  fVar73 = auVar24._8_4_ * auVar23._8_4_;
  fVar77 = auVar24._12_4_ * auVar23._12_4_;
  fVar81 = auVar26._0_4_ * 0.0;
  fVar120 = auVar26._4_4_ * 0.0;
  fVar121 = auVar26._8_4_ * 0.0;
  fVar122 = auVar26._12_4_ * 0.0;
  auVar85._0_4_ = fVar109 + fVar81 + fVar123;
  auVar85._4_4_ = fVar112 + fVar120 + fVar125;
  auVar85._8_4_ = fVar113 + fVar121 + fVar126;
  auVar85._12_4_ = fVar114 + fVar122 + fVar127;
  auVar26 = vshufps_avx(auVar32,auVar32,0xff);
  auVar45 = vshufps_avx(auVar85,auVar85,0xff);
  local_198._0_4_ = auVar45._0_4_ * fVar63;
  local_198._4_4_ = auVar45._4_4_ * fVar62;
  fStack_190 = auVar45._8_4_ * fVar73;
  fStack_18c = auVar45._12_4_ * fVar77;
  local_2a8._0_4_ =
       auVar26._0_4_ * fVar63 + auVar45._0_4_ * auVar23._0_4_ * auVar28._0_4_ * auVar25._0_4_;
  local_2a8._4_4_ =
       auVar26._4_4_ * fVar62 + auVar45._4_4_ * auVar23._4_4_ * auVar28._4_4_ * auVar25._4_4_;
  fStack_2a0 = auVar26._8_4_ * fVar73 +
               auVar45._8_4_ * auVar23._8_4_ * auVar28._8_4_ * auVar25._8_4_;
  fStack_29c = auVar26._12_4_ * fVar77 +
               auVar45._12_4_ * auVar23._12_4_ * auVar28._12_4_ * auVar25._12_4_;
  auVar26._0_4_ = auVar27._0_4_ * 3.0;
  auVar26._4_4_ = auVar27._4_4_ * 3.0;
  auVar26._8_4_ = auVar27._8_4_ * 3.0;
  auVar26._12_4_ = auVar27._12_4_ * 3.0;
  auVar48._0_4_ = fVar21 * 3.0;
  auVar48._4_4_ = fVar40 * 3.0;
  auVar48._8_4_ = fVar42 * 3.0;
  auVar48._12_4_ = fVar44 * 3.0;
  auVar25 = vsubps_avx(auVar48,auVar26);
  auVar103._0_4_ = fVar109 * 0.0;
  auVar103._4_4_ = fVar112 * 0.0;
  auVar103._8_4_ = fVar113 * 0.0;
  auVar103._12_4_ = fVar114 * 0.0;
  auVar27._0_4_ = fVar81 + auVar25._0_4_;
  auVar27._4_4_ = fVar120 + auVar25._4_4_;
  auVar27._8_4_ = fVar121 + auVar25._8_4_;
  auVar27._12_4_ = fVar122 + auVar25._12_4_;
  auVar45 = vsubps_avx(auVar27,auVar103);
  auVar92._0_4_ = fVar64 * 0.0;
  auVar92._4_4_ = fVar74 * 0.0;
  auVar92._8_4_ = fVar78 * 0.0;
  auVar92._12_4_ = fVar82 * 0.0;
  auVar28._0_4_ = auVar92._0_4_ + fVar43 + fVar90 + fVar61;
  auVar28._4_4_ = auVar92._4_4_ + fVar57 + fVar91 + fVar72;
  auVar28._8_4_ = auVar92._8_4_ + fVar58 + fVar22 + fVar76;
  auVar28._12_4_ = auVar92._12_4_ + fVar59 + fVar41 + fVar80;
  auVar26 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar49._0_4_ = auVar26._0_4_ * auVar28._0_4_;
  auVar49._4_4_ = auVar26._4_4_ * auVar28._4_4_;
  auVar49._8_4_ = auVar26._8_4_ * auVar28._8_4_;
  auVar49._12_4_ = auVar26._12_4_ * auVar28._12_4_;
  auVar25 = vshufps_avx(auVar28,auVar28,0xc9);
  fVar63 = auVar45._0_4_;
  auVar29._0_4_ = fVar63 * auVar25._0_4_;
  fVar61 = auVar45._4_4_;
  auVar29._4_4_ = fVar61 * auVar25._4_4_;
  fVar62 = auVar45._8_4_;
  auVar29._8_4_ = fVar62 * auVar25._8_4_;
  fVar72 = auVar45._12_4_;
  auVar29._12_4_ = fVar72 * auVar25._12_4_;
  auVar25 = vsubps_avx(auVar49,auVar29);
  auVar27 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar25 = vdpps_avx(auVar27,auVar27,0x7f);
  auVar119._0_4_ = auVar103._0_4_ + fVar81 + fVar21 + fVar60;
  auVar119._4_4_ = auVar103._4_4_ + fVar120 + fVar40 + fVar71;
  auVar119._8_4_ = auVar103._8_4_ + fVar121 + fVar42 + fVar75;
  auVar119._12_4_ = auVar103._12_4_ + fVar122 + fVar44 + fVar79;
  fVar44 = auVar25._0_4_;
  auVar30._4_12_ = ZEXT812(0) << 0x20;
  auVar30._0_4_ = fVar44;
  auVar23 = vrsqrtss_avx(auVar30,auVar30);
  fVar64 = auVar23._0_4_;
  auVar107._0_4_ = fVar90 * 3.0;
  auVar107._4_4_ = fVar91 * 3.0;
  auVar107._8_4_ = fVar22 * 3.0;
  auVar107._12_4_ = fVar41 * 3.0;
  auVar97._0_4_ = *pfVar2 * 3.0;
  auVar97._4_4_ = pfVar2[1] * 3.0;
  auVar97._8_4_ = pfVar2[2] * 3.0;
  auVar97._12_4_ = pfVar2[3] * 3.0;
  auVar23 = vsubps_avx(auVar107,auVar97);
  auVar98._0_4_ = fVar43 + auVar23._0_4_;
  auVar98._4_4_ = fVar57 + auVar23._4_4_;
  auVar98._8_4_ = fVar58 + auVar23._8_4_;
  auVar98._12_4_ = fVar59 + auVar23._12_4_;
  auVar23 = vsubps_avx(auVar98,auVar92);
  auVar86._0_4_ = auVar26._0_4_ * auVar23._0_4_;
  auVar86._4_4_ = auVar26._4_4_ * auVar23._4_4_;
  auVar86._8_4_ = auVar26._8_4_ * auVar23._8_4_;
  auVar86._12_4_ = auVar26._12_4_ * auVar23._12_4_;
  auVar23 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar93._0_4_ = fVar63 * auVar23._0_4_;
  auVar93._4_4_ = fVar61 * auVar23._4_4_;
  auVar93._8_4_ = fVar62 * auVar23._8_4_;
  auVar93._12_4_ = fVar72 * auVar23._12_4_;
  auVar23 = vsubps_avx(auVar86,auVar93);
  auVar26 = vshufps_avx(auVar23,auVar23,0xc9);
  auVar23 = vdpps_avx(auVar27,auVar26,0x7f);
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  auVar87._0_4_ = auVar25._0_4_ * auVar26._0_4_;
  auVar87._4_4_ = auVar25._4_4_ * auVar26._4_4_;
  auVar87._8_4_ = auVar25._8_4_ * auVar26._8_4_;
  auVar87._12_4_ = auVar25._12_4_ * auVar26._12_4_;
  auVar25 = vshufps_avx(auVar23,auVar23,0);
  auVar94._0_4_ = auVar27._0_4_ * auVar25._0_4_;
  auVar94._4_4_ = auVar27._4_4_ * auVar25._4_4_;
  auVar94._8_4_ = auVar27._8_4_ * auVar25._8_4_;
  auVar94._12_4_ = auVar27._12_4_ * auVar25._12_4_;
  auVar24 = vsubps_avx(auVar87,auVar94);
  auVar23 = vshufps_avx(auVar119,auVar119,0xff);
  auVar25 = ZEXT416((uint)(fVar64 * 1.5 - fVar44 * 0.5 * fVar64 * fVar64 * fVar64));
  auVar26 = vshufps_avx(auVar25,auVar25,0);
  fVar64 = auVar27._0_4_ * auVar26._0_4_;
  fVar74 = auVar27._4_4_ * auVar26._4_4_;
  fVar78 = auVar27._8_4_ * auVar26._8_4_;
  fVar82 = auVar27._12_4_ * auVar26._12_4_;
  auVar25 = vrcpss_avx(auVar30,auVar30);
  auVar27 = vshufps_avx(auVar45,auVar45,0xff);
  local_f8._0_4_ = auVar23._0_4_ * fVar64;
  local_f8._4_4_ = auVar23._4_4_ * fVar74;
  fStack_f0 = auVar23._8_4_ * fVar78;
  fStack_ec = auVar23._12_4_ * fVar82;
  auVar124._0_4_ = auVar119._0_4_ + (float)local_f8._0_4_;
  auVar124._4_4_ = auVar119._4_4_ + (float)local_f8._4_4_;
  auVar124._8_4_ = auVar119._8_4_ + fStack_f0;
  auVar124._12_4_ = auVar119._12_4_ + fStack_ec;
  auVar25 = ZEXT416((uint)(auVar25._0_4_ * (2.0 - fVar44 * auVar25._0_4_)));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  local_298._0_4_ =
       auVar27._0_4_ * fVar64 + auVar23._0_4_ * auVar26._0_4_ * auVar24._0_4_ * auVar25._0_4_;
  local_298._4_4_ =
       auVar27._4_4_ * fVar74 + auVar23._4_4_ * auVar26._4_4_ * auVar24._4_4_ * auVar25._4_4_;
  fStack_290 = auVar27._8_4_ * fVar78 +
               auVar23._8_4_ * auVar26._8_4_ * auVar24._8_4_ * auVar25._8_4_;
  fStack_28c = auVar27._12_4_ * fVar82 +
               auVar23._12_4_ * auVar26._12_4_ * auVar24._12_4_ * auVar25._12_4_;
  auVar31._0_4_ = (fVar63 + (float)local_298._0_4_) * 0.33333334;
  auVar31._4_4_ = (fVar61 + (float)local_298._4_4_) * 0.33333334;
  auVar31._8_4_ = (fVar62 + fStack_290) * 0.33333334;
  auVar31._12_4_ = (fVar72 + fStack_28c) * 0.33333334;
  auVar26 = vsubps_avx(auVar124,auVar31);
  auVar25 = vshufps_avx(auVar26,auVar26,0xaa);
  fVar22 = auVar25._0_4_;
  fVar41 = auVar25._4_4_;
  fVar21 = auVar25._8_4_;
  fVar63 = auVar25._12_4_;
  auVar25 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar44 = auVar25._0_4_;
  fVar74 = auVar25._4_4_;
  fVar82 = auVar25._8_4_;
  fVar91 = auVar25._12_4_;
  auVar104._0_4_ = (float)local_198._0_4_ + auVar85._0_4_;
  auVar104._4_4_ = (float)local_198._4_4_ + auVar85._4_4_;
  auVar104._8_4_ = fStack_190 + auVar85._8_4_;
  auVar104._12_4_ = fStack_18c + auVar85._12_4_;
  auVar108._0_4_ = auVar104._0_4_ + ((float)local_2a8._0_4_ + fVar96) * 0.33333334;
  auVar108._4_4_ = auVar104._4_4_ + ((float)local_2a8._4_4_ + fVar100) * 0.33333334;
  auVar108._8_4_ = auVar104._8_4_ + (fStack_2a0 + fVar101) * 0.33333334;
  auVar108._12_4_ = auVar104._12_4_ + (fStack_29c + fVar102) * 0.33333334;
  auVar25 = vshufps_avx(auVar108,auVar108,0xaa);
  fVar64 = auVar25._0_4_;
  fVar78 = auVar25._4_4_;
  fVar90 = auVar25._8_4_;
  auVar23 = vshufps_avx(auVar104,auVar104,0xaa);
  fVar40 = auVar23._0_4_;
  fVar42 = auVar23._4_4_;
  fVar43 = auVar23._8_4_;
  auVar51._0_4_ =
       fVar40 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar64 +
       fVar22 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar44;
  auVar51._4_4_ =
       fVar42 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar78 +
       fVar41 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar74;
  auVar51._8_4_ =
       fVar43 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar90 +
       fVar21 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar82;
  auVar51._12_4_ =
       auVar23._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * auVar25._12_4_ +
       fVar63 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar91;
  auVar51._16_4_ =
       fVar40 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar64 +
       fVar22 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar44;
  auVar51._20_4_ =
       fVar42 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar78 +
       fVar41 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar74;
  auVar51._24_4_ =
       fVar43 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar90 +
       fVar21 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar82;
  auVar51._28_4_ = 0;
  auVar33._0_4_ =
       fVar40 * (float)bezier_basis0._5100_4_ +
       fVar64 * (float)bezier_basis0._6256_4_ +
       fVar22 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar44;
  auVar33._4_4_ =
       fVar42 * (float)bezier_basis0._5104_4_ +
       fVar78 * (float)bezier_basis0._6260_4_ +
       fVar41 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar74;
  auVar33._8_4_ =
       fVar43 * (float)bezier_basis0._5108_4_ +
       fVar90 * (float)bezier_basis0._6264_4_ +
       fVar21 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar82;
  auVar33._12_4_ =
       auVar23._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar25._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar63 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar91;
  auVar33._16_4_ =
       fVar40 * (float)bezier_basis0._5116_4_ +
       fVar64 * (float)bezier_basis0._6272_4_ +
       fVar22 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar44;
  auVar33._20_4_ =
       fVar42 * (float)bezier_basis0._5120_4_ +
       fVar78 * (float)bezier_basis0._6276_4_ +
       fVar41 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar74;
  auVar33._24_4_ =
       fVar43 * (float)bezier_basis0._5124_4_ +
       fVar90 * (float)bezier_basis0._6280_4_ +
       fVar21 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar82;
  auVar33._28_4_ = (float)bezier_basis0._6284_4_ + (float)bezier_basis0._6284_4_ + fVar63 + fVar91;
  auVar34 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,1);
  auVar10._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar10._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar10._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar10._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar10._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar10._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar10._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar10._28_4_ = auVar34._28_4_;
  auVar14 = vsubps_avx(auVar51,auVar10);
  auVar34 = vblendps_avx(auVar33,ZEXT432(0) << 0x20,0x80);
  auVar88._0_4_ = auVar51._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar88._4_4_ = auVar51._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar88._8_4_ = auVar51._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar88._12_4_ = auVar51._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar88._16_4_ = auVar51._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar88._20_4_ = auVar51._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar88._24_4_ = auVar51._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar88._28_4_ = auVar34._28_4_ + 0.0;
  auVar34._8_4_ = 0xff800000;
  auVar34._0_8_ = 0xff800000ff800000;
  auVar34._12_4_ = 0xff800000;
  auVar34._16_4_ = 0xff800000;
  auVar34._20_4_ = 0xff800000;
  auVar34._24_4_ = 0xff800000;
  auVar34._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar34,auVar51);
  auVar10 = vmaxps_avx(auVar14,auVar88);
  auVar33 = vmaxps_avx(auVar34,auVar10);
  auVar25 = vshufps_avx(auVar26,auVar26,0x55);
  auVar23 = vshufps_avx(auVar124,auVar124,0x55);
  fVar44 = auVar25._0_4_;
  fVar64 = auVar25._4_4_;
  fVar74 = auVar25._8_4_;
  fVar78 = auVar25._12_4_;
  fVar82 = auVar23._0_4_;
  fVar90 = auVar23._4_4_;
  fVar91 = auVar23._8_4_;
  fVar22 = auVar23._12_4_;
  auVar25 = vshufps_avx(auVar108,auVar108,0x55);
  fVar41 = auVar25._0_4_;
  fVar21 = auVar25._4_4_;
  fVar63 = auVar25._8_4_;
  auVar23 = vshufps_avx(auVar104,auVar104,0x55);
  fVar40 = auVar23._0_4_;
  fVar42 = auVar23._4_4_;
  fVar43 = auVar23._8_4_;
  auVar35._0_4_ =
       fVar40 * (float)bezier_basis0._476_4_ +
       fVar41 * (float)bezier_basis0._1632_4_ +
       fVar82 * (float)bezier_basis0._3944_4_ + (float)bezier_basis0._2788_4_ * fVar44;
  auVar35._4_4_ =
       fVar42 * (float)bezier_basis0._480_4_ +
       fVar21 * (float)bezier_basis0._1636_4_ +
       fVar90 * (float)bezier_basis0._3948_4_ + (float)bezier_basis0._2792_4_ * fVar64;
  auVar35._8_4_ =
       fVar43 * (float)bezier_basis0._484_4_ +
       fVar63 * (float)bezier_basis0._1640_4_ +
       fVar91 * (float)bezier_basis0._3952_4_ + (float)bezier_basis0._2796_4_ * fVar74;
  auVar35._12_4_ =
       auVar23._12_4_ * (float)bezier_basis0._488_4_ +
       auVar25._12_4_ * (float)bezier_basis0._1644_4_ +
       fVar22 * (float)bezier_basis0._3956_4_ + (float)bezier_basis0._2800_4_ * fVar78;
  auVar35._16_4_ =
       fVar40 * (float)bezier_basis0._492_4_ +
       fVar41 * (float)bezier_basis0._1648_4_ +
       fVar82 * (float)bezier_basis0._3960_4_ + (float)bezier_basis0._2804_4_ * fVar44;
  auVar35._20_4_ =
       fVar42 * (float)bezier_basis0._496_4_ +
       fVar21 * (float)bezier_basis0._1652_4_ +
       fVar90 * (float)bezier_basis0._3964_4_ + (float)bezier_basis0._2808_4_ * fVar64;
  auVar35._24_4_ =
       fVar43 * (float)bezier_basis0._500_4_ +
       fVar63 * (float)bezier_basis0._1656_4_ +
       fVar91 * (float)bezier_basis0._3968_4_ + (float)bezier_basis0._2812_4_ * fVar74;
  auVar35._28_4_ = 0x3d638e39;
  auVar69._0_4_ =
       fVar40 * (float)bezier_basis0._5100_4_ +
       fVar41 * (float)bezier_basis0._6256_4_ +
       fVar44 * (float)bezier_basis0._7412_4_ + (float)bezier_basis0._8568_4_ * fVar82;
  auVar69._4_4_ =
       fVar42 * (float)bezier_basis0._5104_4_ +
       fVar21 * (float)bezier_basis0._6260_4_ +
       fVar64 * (float)bezier_basis0._7416_4_ + (float)bezier_basis0._8572_4_ * fVar90;
  auVar69._8_4_ =
       fVar43 * (float)bezier_basis0._5108_4_ +
       fVar63 * (float)bezier_basis0._6264_4_ +
       fVar74 * (float)bezier_basis0._7420_4_ + (float)bezier_basis0._8576_4_ * fVar91;
  auVar69._12_4_ =
       auVar23._12_4_ * (float)bezier_basis0._5112_4_ +
       auVar25._12_4_ * (float)bezier_basis0._6268_4_ +
       fVar78 * (float)bezier_basis0._7424_4_ + (float)bezier_basis0._8580_4_ * fVar22;
  auVar69._16_4_ =
       fVar40 * (float)bezier_basis0._5116_4_ +
       fVar41 * (float)bezier_basis0._6272_4_ +
       fVar44 * (float)bezier_basis0._7428_4_ + (float)bezier_basis0._8584_4_ * fVar82;
  auVar69._20_4_ =
       fVar42 * (float)bezier_basis0._5120_4_ +
       fVar21 * (float)bezier_basis0._6276_4_ +
       fVar64 * (float)bezier_basis0._7432_4_ + (float)bezier_basis0._8588_4_ * fVar90;
  auVar69._24_4_ =
       fVar43 * (float)bezier_basis0._5124_4_ +
       fVar63 * (float)bezier_basis0._6280_4_ +
       fVar74 * (float)bezier_basis0._7436_4_ + (float)bezier_basis0._8592_4_ * fVar91;
  auVar69._28_4_ = fVar22 + fVar22 + fVar78 + fVar22;
  auVar34 = vblendps_avx(auVar69,ZEXT832(0) << 0x20,1);
  auVar11._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar11._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar11._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar11._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar11._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar11._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar11._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar11._28_4_ = auVar34._28_4_;
  auVar15 = vsubps_avx(auVar35,auVar11);
  auVar34 = vblendps_avx(auVar69,ZEXT832(0) << 0x20,0x80);
  auVar70._0_4_ = auVar35._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar70._4_4_ = auVar35._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar70._8_4_ = auVar35._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar70._12_4_ = auVar35._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar70._16_4_ = auVar35._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar70._20_4_ = auVar35._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar70._24_4_ = auVar35._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar70._28_4_ = auVar34._28_4_ + 0.055555556;
  auVar99._8_4_ = 0xff800000;
  auVar99._0_8_ = 0xff800000ff800000;
  auVar99._12_4_ = 0xff800000;
  auVar99._16_4_ = 0xff800000;
  auVar99._20_4_ = 0xff800000;
  auVar99._24_4_ = 0xff800000;
  auVar99._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar99,auVar35);
  auVar10 = vmaxps_avx(auVar15,auVar70);
  auVar11 = vmaxps_avx(auVar34,auVar10);
  auVar25 = vshufps_avx(auVar26,auVar26,0);
  auVar23 = vshufps_avx(auVar124,auVar124,0);
  fVar41 = auVar25._0_4_;
  fVar21 = auVar25._4_4_;
  fVar63 = auVar25._8_4_;
  fVar40 = auVar25._12_4_;
  fVar42 = auVar23._0_4_;
  fVar43 = auVar23._4_4_;
  fVar57 = auVar23._8_4_;
  fVar58 = auVar23._12_4_;
  auVar25 = vpermilps_avx(auVar108,0);
  fVar44 = auVar25._0_4_;
  fVar74 = auVar25._4_4_;
  fVar82 = auVar25._8_4_;
  fVar91 = auVar25._12_4_;
  auVar25 = vpermilps_avx(auVar104,0);
  fVar64 = auVar25._0_4_;
  fVar78 = auVar25._4_4_;
  fVar90 = auVar25._8_4_;
  fVar22 = auVar25._12_4_;
  auVar118._0_4_ =
       (float)bezier_basis0._476_4_ * fVar64 +
       (float)bezier_basis0._1632_4_ * fVar44 +
       fVar41 * (float)bezier_basis0._2788_4_ + fVar42 * (float)bezier_basis0._3944_4_;
  auVar118._4_4_ =
       (float)bezier_basis0._480_4_ * fVar78 +
       (float)bezier_basis0._1636_4_ * fVar74 +
       fVar21 * (float)bezier_basis0._2792_4_ + fVar43 * (float)bezier_basis0._3948_4_;
  auVar118._8_4_ =
       (float)bezier_basis0._484_4_ * fVar90 +
       (float)bezier_basis0._1640_4_ * fVar82 +
       fVar63 * (float)bezier_basis0._2796_4_ + fVar57 * (float)bezier_basis0._3952_4_;
  auVar118._12_4_ =
       (float)bezier_basis0._488_4_ * fVar22 +
       (float)bezier_basis0._1644_4_ * fVar91 +
       fVar40 * (float)bezier_basis0._2800_4_ + fVar58 * (float)bezier_basis0._3956_4_;
  auVar118._16_4_ =
       (float)bezier_basis0._492_4_ * fVar64 +
       (float)bezier_basis0._1648_4_ * fVar44 +
       fVar41 * (float)bezier_basis0._2804_4_ + fVar42 * (float)bezier_basis0._3960_4_;
  auVar118._20_4_ =
       (float)bezier_basis0._496_4_ * fVar78 +
       (float)bezier_basis0._1652_4_ * fVar74 +
       fVar21 * (float)bezier_basis0._2808_4_ + fVar43 * (float)bezier_basis0._3964_4_;
  auVar118._24_4_ =
       (float)bezier_basis0._500_4_ * fVar90 +
       (float)bezier_basis0._1656_4_ * fVar82 +
       fVar63 * (float)bezier_basis0._2812_4_ + fVar57 * (float)bezier_basis0._3968_4_;
  auVar118._28_4_ = auVar10._28_4_ + 0.0 + 0.0 + 0.0;
  auVar52._0_4_ =
       fVar64 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar44 +
       fVar42 * (float)bezier_basis0._8568_4_ + fVar41 * (float)bezier_basis0._7412_4_;
  auVar52._4_4_ =
       fVar78 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar74 +
       fVar43 * (float)bezier_basis0._8572_4_ + fVar21 * (float)bezier_basis0._7416_4_;
  auVar52._8_4_ =
       fVar90 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar82 +
       fVar57 * (float)bezier_basis0._8576_4_ + fVar63 * (float)bezier_basis0._7420_4_;
  auVar52._12_4_ =
       fVar22 * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * fVar91 +
       fVar58 * (float)bezier_basis0._8580_4_ + fVar40 * (float)bezier_basis0._7424_4_;
  auVar52._16_4_ =
       fVar64 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar44 +
       fVar42 * (float)bezier_basis0._8584_4_ + fVar41 * (float)bezier_basis0._7428_4_;
  auVar52._20_4_ =
       fVar78 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar74 +
       fVar43 * (float)bezier_basis0._8588_4_ + fVar21 * (float)bezier_basis0._7432_4_;
  auVar52._24_4_ =
       fVar90 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar82 +
       fVar57 * (float)bezier_basis0._8592_4_ + fVar63 * (float)bezier_basis0._7436_4_;
  auVar52._28_4_ = fVar22 + fVar91 + fVar58 + fVar40;
  auVar34 = vblendps_avx(auVar52,ZEXT432(0) << 0x20,1);
  auVar12._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar12._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar12._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar12._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar12._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar12._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar12._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar12._28_4_ = auVar34._28_4_;
  auVar69 = vsubps_avx(auVar118,auVar12);
  auVar34 = vblendps_avx(auVar52,ZEXT432(0) << 0x20,0x80);
  auVar53._0_4_ = auVar118._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar53._4_4_ = auVar118._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar53._8_4_ = auVar118._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar53._12_4_ = auVar118._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar53._16_4_ = auVar118._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar53._20_4_ = auVar118._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar53._24_4_ = auVar118._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar53._28_4_ = auVar118._28_4_ + auVar34._28_4_;
  auVar95._8_4_ = 0xff800000;
  auVar95._0_8_ = 0xff800000ff800000;
  auVar95._12_4_ = 0xff800000;
  auVar95._16_4_ = 0xff800000;
  auVar95._20_4_ = 0xff800000;
  auVar95._24_4_ = 0xff800000;
  auVar95._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar95,auVar118);
  auVar10 = vmaxps_avx(auVar69,auVar53);
  auVar12 = vmaxps_avx(auVar34,auVar10);
  auVar34 = vminps_avx(auVar14,auVar88);
  auVar110._8_4_ = 0x7f800000;
  auVar110._0_8_ = 0x7f8000007f800000;
  auVar110._12_4_ = 0x7f800000;
  auVar110._16_4_ = 0x7f800000;
  auVar110._20_4_ = 0x7f800000;
  auVar110._24_4_ = 0x7f800000;
  auVar110._28_4_ = 0x7f800000;
  auVar10 = vminps_avx(auVar110,auVar51);
  auVar51 = vminps_avx(auVar10,auVar34);
  auVar10 = vminps_avx(auVar15,auVar70);
  auVar14 = vminps_avx(auVar110,auVar35);
  auVar35 = vminps_avx(auVar14,auVar10);
  auVar10 = vminps_avx(auVar69,auVar53);
  auVar14 = vminps_avx(auVar110,auVar118);
  auVar69 = vminps_avx(auVar14,auVar10);
  auVar26 = vsubps_avx(auVar85,_local_198);
  auVar27 = vsubps_avx(auVar32,_local_2a8);
  auVar24 = vsubps_avx(auVar119,_local_f8);
  auVar25 = vsubps_avx(auVar45,_local_298);
  auVar50._0_4_ = auVar25._0_4_ * 0.33333334;
  auVar50._4_4_ = auVar25._4_4_ * 0.33333334;
  auVar50._8_4_ = auVar25._8_4_ * 0.33333334;
  auVar50._12_4_ = auVar25._12_4_ * 0.33333334;
  auVar45 = vsubps_avx(auVar24,auVar50);
  auVar25 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar23 = vshufps_avx(auVar24,auVar24,0xaa);
  fVar41 = auVar25._0_4_;
  fVar21 = auVar25._4_4_;
  fVar63 = auVar25._8_4_;
  fVar40 = auVar25._12_4_;
  fVar44 = auVar23._0_4_;
  fVar74 = auVar23._4_4_;
  fVar82 = auVar23._8_4_;
  fVar91 = auVar23._12_4_;
  auVar32._0_4_ = auVar26._0_4_ + auVar27._0_4_ * 0.33333334;
  auVar32._4_4_ = auVar26._4_4_ + auVar27._4_4_ * 0.33333334;
  auVar32._8_4_ = auVar26._8_4_ + auVar27._8_4_ * 0.33333334;
  auVar32._12_4_ = auVar26._12_4_ + auVar27._12_4_ * 0.33333334;
  auVar25 = vshufps_avx(auVar32,auVar32,0xaa);
  fVar64 = auVar25._0_4_;
  fVar78 = auVar25._4_4_;
  fVar90 = auVar25._8_4_;
  fVar22 = auVar25._12_4_;
  auVar25 = vshufps_avx(auVar26,auVar26,0xaa);
  fVar42 = auVar25._0_4_;
  fVar43 = auVar25._4_4_;
  fVar57 = auVar25._8_4_;
  auVar105._0_4_ =
       fVar42 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar64 +
       fVar41 * (float)bezier_basis0._2788_4_ + (float)bezier_basis0._3944_4_ * fVar44;
  auVar105._4_4_ =
       fVar43 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar78 +
       fVar21 * (float)bezier_basis0._2792_4_ + (float)bezier_basis0._3948_4_ * fVar74;
  auVar105._8_4_ =
       fVar57 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar90 +
       fVar63 * (float)bezier_basis0._2796_4_ + (float)bezier_basis0._3952_4_ * fVar82;
  auVar105._12_4_ =
       auVar25._12_4_ * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * fVar22 +
       fVar40 * (float)bezier_basis0._2800_4_ + (float)bezier_basis0._3956_4_ * fVar91;
  auVar105._16_4_ =
       fVar42 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar64 +
       fVar41 * (float)bezier_basis0._2804_4_ + (float)bezier_basis0._3960_4_ * fVar44;
  auVar105._20_4_ =
       fVar43 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar78 +
       fVar21 * (float)bezier_basis0._2808_4_ + (float)bezier_basis0._3964_4_ * fVar74;
  auVar105._24_4_ =
       fVar57 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar90 +
       fVar63 * (float)bezier_basis0._2812_4_ + (float)bezier_basis0._3968_4_ * fVar82;
  auVar105._28_4_ = auVar118._28_4_ + auVar34._28_4_ + 0.0 + 0.0;
  auVar36._0_4_ =
       fVar42 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar64 +
       fVar41 * (float)bezier_basis0._7412_4_ + fVar44 * (float)bezier_basis0._8568_4_;
  auVar36._4_4_ =
       fVar43 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar78 +
       fVar21 * (float)bezier_basis0._7416_4_ + fVar74 * (float)bezier_basis0._8572_4_;
  auVar36._8_4_ =
       fVar57 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar90 +
       fVar63 * (float)bezier_basis0._7420_4_ + fVar82 * (float)bezier_basis0._8576_4_;
  auVar36._12_4_ =
       auVar25._12_4_ * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * fVar22 +
       fVar40 * (float)bezier_basis0._7424_4_ + fVar91 * (float)bezier_basis0._8580_4_;
  auVar36._16_4_ =
       fVar42 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar64 +
       fVar41 * (float)bezier_basis0._7428_4_ + fVar44 * (float)bezier_basis0._8584_4_;
  auVar36._20_4_ =
       fVar43 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar78 +
       fVar21 * (float)bezier_basis0._7432_4_ + fVar74 * (float)bezier_basis0._8588_4_;
  auVar36._24_4_ =
       fVar57 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar90 +
       fVar63 * (float)bezier_basis0._7436_4_ + fVar82 * (float)bezier_basis0._8592_4_;
  auVar36._28_4_ = fVar40 + fVar91 + fVar22 + fVar40 + fVar91;
  auVar34 = vblendps_avx(auVar36,ZEXT832(0) << 0x20,1);
  auVar14._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar14._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar14._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar14._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar14._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar14._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar14._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar14._28_4_ = auVar34._28_4_;
  auVar52 = vsubps_avx(auVar105,auVar14);
  auVar34 = vblendps_avx(auVar36,ZEXT832(0) << 0x20,0x80);
  auVar54._0_4_ = auVar105._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar54._4_4_ = auVar105._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar54._8_4_ = auVar105._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar54._12_4_ = auVar105._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar54._16_4_ = auVar105._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar54._20_4_ = auVar105._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar54._24_4_ = auVar105._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar54._28_4_ = auVar105._28_4_ + auVar34._28_4_;
  auVar37._8_4_ = 0xff800000;
  auVar37._0_8_ = 0xff800000ff800000;
  auVar37._12_4_ = 0xff800000;
  auVar37._16_4_ = 0xff800000;
  auVar37._20_4_ = 0xff800000;
  auVar37._24_4_ = 0xff800000;
  auVar37._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar37,auVar105);
  auVar10 = vmaxps_avx(auVar52,auVar54);
  auVar14 = vmaxps_avx(auVar34,auVar10);
  auVar25 = vshufps_avx(auVar45,auVar45,0x55);
  auVar23 = vshufps_avx(auVar24,auVar24,0x55);
  fVar44 = auVar25._0_4_;
  fVar74 = auVar25._4_4_;
  fVar82 = auVar25._8_4_;
  fVar22 = auVar25._12_4_;
  fVar64 = auVar23._0_4_;
  fVar78 = auVar23._4_4_;
  fVar90 = auVar23._8_4_;
  fVar41 = auVar23._12_4_;
  auVar25 = vshufps_avx(auVar32,auVar32,0x55);
  fVar43 = auVar25._0_4_;
  fVar57 = auVar25._4_4_;
  fVar58 = auVar25._8_4_;
  fVar59 = auVar25._12_4_;
  auVar25 = vshufps_avx(auVar26,auVar26,0x55);
  fVar21 = auVar25._0_4_;
  fVar63 = auVar25._4_4_;
  fVar40 = auVar25._8_4_;
  fVar42 = auVar25._12_4_;
  auVar106._0_4_ =
       fVar21 * (float)bezier_basis0._476_4_ +
       fVar43 * (float)bezier_basis0._1632_4_ +
       (float)bezier_basis0._2788_4_ * fVar44 + (float)bezier_basis0._3944_4_ * fVar64;
  auVar106._4_4_ =
       fVar63 * (float)bezier_basis0._480_4_ +
       fVar57 * (float)bezier_basis0._1636_4_ +
       (float)bezier_basis0._2792_4_ * fVar74 + (float)bezier_basis0._3948_4_ * fVar78;
  auVar106._8_4_ =
       fVar40 * (float)bezier_basis0._484_4_ +
       fVar58 * (float)bezier_basis0._1640_4_ +
       (float)bezier_basis0._2796_4_ * fVar82 + (float)bezier_basis0._3952_4_ * fVar90;
  auVar106._12_4_ =
       fVar42 * (float)bezier_basis0._488_4_ +
       fVar59 * (float)bezier_basis0._1644_4_ +
       (float)bezier_basis0._2800_4_ * fVar22 + (float)bezier_basis0._3956_4_ * fVar41;
  auVar106._16_4_ =
       fVar21 * (float)bezier_basis0._492_4_ +
       fVar43 * (float)bezier_basis0._1648_4_ +
       (float)bezier_basis0._2804_4_ * fVar44 + (float)bezier_basis0._3960_4_ * fVar64;
  auVar106._20_4_ =
       fVar63 * (float)bezier_basis0._496_4_ +
       fVar57 * (float)bezier_basis0._1652_4_ +
       (float)bezier_basis0._2808_4_ * fVar74 + (float)bezier_basis0._3964_4_ * fVar78;
  auVar106._24_4_ =
       fVar40 * (float)bezier_basis0._500_4_ +
       fVar58 * (float)bezier_basis0._1656_4_ +
       (float)bezier_basis0._2812_4_ * fVar82 + (float)bezier_basis0._3968_4_ * fVar90;
  auVar106._28_4_ = fVar91 + auVar105._28_4_ + 0.0 + 0.0;
  auVar38._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar21 +
       fVar43 * (float)bezier_basis0._6256_4_ +
       fVar44 * (float)bezier_basis0._7412_4_ + fVar64 * (float)bezier_basis0._8568_4_;
  auVar38._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar63 +
       fVar57 * (float)bezier_basis0._6260_4_ +
       fVar74 * (float)bezier_basis0._7416_4_ + fVar78 * (float)bezier_basis0._8572_4_;
  auVar38._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar40 +
       fVar58 * (float)bezier_basis0._6264_4_ +
       fVar82 * (float)bezier_basis0._7420_4_ + fVar90 * (float)bezier_basis0._8576_4_;
  auVar38._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar42 +
       fVar59 * (float)bezier_basis0._6268_4_ +
       fVar22 * (float)bezier_basis0._7424_4_ + fVar41 * (float)bezier_basis0._8580_4_;
  auVar38._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar21 +
       fVar43 * (float)bezier_basis0._6272_4_ +
       fVar44 * (float)bezier_basis0._7428_4_ + fVar64 * (float)bezier_basis0._8584_4_;
  auVar38._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar63 +
       fVar57 * (float)bezier_basis0._6276_4_ +
       fVar74 * (float)bezier_basis0._7432_4_ + fVar78 * (float)bezier_basis0._8588_4_;
  auVar38._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar40 +
       fVar58 * (float)bezier_basis0._6280_4_ +
       fVar82 * (float)bezier_basis0._7436_4_ + fVar90 * (float)bezier_basis0._8592_4_;
  auVar38._28_4_ = fVar42 + fVar41 + fVar22 + fVar41;
  auVar34 = vblendps_avx(auVar38,ZEXT832(0) << 0x20,1);
  auVar15._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar15._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar15._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar15._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar15._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar15._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar15._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar15._28_4_ = auVar34._28_4_;
  auVar36 = vsubps_avx(auVar106,auVar15);
  auVar34 = vblendps_avx(auVar38,ZEXT832(0) << 0x20,0x80);
  auVar39._0_4_ = auVar106._0_4_ + auVar34._0_4_ * 0.055555556;
  auVar39._4_4_ = auVar106._4_4_ + auVar34._4_4_ * 0.055555556;
  auVar39._8_4_ = auVar106._8_4_ + auVar34._8_4_ * 0.055555556;
  auVar39._12_4_ = auVar106._12_4_ + auVar34._12_4_ * 0.055555556;
  auVar39._16_4_ = auVar106._16_4_ + auVar34._16_4_ * 0.055555556;
  auVar39._20_4_ = auVar106._20_4_ + auVar34._20_4_ * 0.055555556;
  auVar39._24_4_ = auVar106._24_4_ + auVar34._24_4_ * 0.055555556;
  auVar39._28_4_ = auVar106._28_4_ + auVar34._28_4_;
  auVar55._8_4_ = 0xff800000;
  auVar55._0_8_ = 0xff800000ff800000;
  auVar55._12_4_ = 0xff800000;
  auVar55._16_4_ = 0xff800000;
  auVar55._20_4_ = 0xff800000;
  auVar55._24_4_ = 0xff800000;
  auVar55._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar55,auVar106);
  auVar10 = vmaxps_avx(auVar36,auVar39);
  auVar15 = vmaxps_avx(auVar34,auVar10);
  auVar25 = vshufps_avx(auVar45,auVar45,0);
  fVar44 = auVar25._0_4_;
  fVar74 = auVar25._4_4_;
  fVar82 = auVar25._8_4_;
  fVar91 = auVar25._12_4_;
  auVar25 = vpermilps_avx(auVar24,0);
  fVar41 = auVar25._0_4_;
  fVar21 = auVar25._4_4_;
  fVar63 = auVar25._8_4_;
  fVar40 = auVar25._12_4_;
  auVar25 = vshufps_avx(auVar32,auVar32,0);
  fVar64 = auVar25._0_4_;
  fVar78 = auVar25._4_4_;
  fVar90 = auVar25._8_4_;
  fVar22 = auVar25._12_4_;
  auVar25 = vshufps_avx(auVar26,auVar26,0);
  fVar42 = auVar25._0_4_;
  fVar43 = auVar25._4_4_;
  fVar57 = auVar25._8_4_;
  fVar58 = auVar25._12_4_;
  auVar115._0_4_ =
       fVar42 * (float)bezier_basis0._476_4_ +
       (float)bezier_basis0._1632_4_ * fVar64 +
       (float)bezier_basis0._2788_4_ * fVar44 + fVar41 * (float)bezier_basis0._3944_4_;
  auVar115._4_4_ =
       fVar43 * (float)bezier_basis0._480_4_ +
       (float)bezier_basis0._1636_4_ * fVar78 +
       (float)bezier_basis0._2792_4_ * fVar74 + fVar21 * (float)bezier_basis0._3948_4_;
  auVar115._8_4_ =
       fVar57 * (float)bezier_basis0._484_4_ +
       (float)bezier_basis0._1640_4_ * fVar90 +
       (float)bezier_basis0._2796_4_ * fVar82 + fVar63 * (float)bezier_basis0._3952_4_;
  auVar115._12_4_ =
       fVar58 * (float)bezier_basis0._488_4_ +
       (float)bezier_basis0._1644_4_ * fVar22 +
       (float)bezier_basis0._2800_4_ * fVar91 + fVar40 * (float)bezier_basis0._3956_4_;
  auVar115._16_4_ =
       fVar42 * (float)bezier_basis0._492_4_ +
       (float)bezier_basis0._1648_4_ * fVar64 +
       (float)bezier_basis0._2804_4_ * fVar44 + fVar41 * (float)bezier_basis0._3960_4_;
  auVar115._20_4_ =
       fVar43 * (float)bezier_basis0._496_4_ +
       (float)bezier_basis0._1652_4_ * fVar78 +
       (float)bezier_basis0._2808_4_ * fVar74 + fVar21 * (float)bezier_basis0._3964_4_;
  auVar115._24_4_ =
       fVar57 * (float)bezier_basis0._500_4_ +
       (float)bezier_basis0._1656_4_ * fVar90 +
       (float)bezier_basis0._2812_4_ * fVar82 + fVar63 * (float)bezier_basis0._3968_4_;
  auVar115._28_4_ = fVar59 + fVar59 + (float)bezier_basis0._6284_4_ + fVar59;
  auVar56._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar42 +
       fVar64 * (float)bezier_basis0._6256_4_ +
       fVar44 * (float)bezier_basis0._7412_4_ + fVar41 * (float)bezier_basis0._8568_4_;
  auVar56._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar43 +
       fVar78 * (float)bezier_basis0._6260_4_ +
       fVar74 * (float)bezier_basis0._7416_4_ + fVar21 * (float)bezier_basis0._8572_4_;
  auVar56._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar57 +
       fVar90 * (float)bezier_basis0._6264_4_ +
       fVar82 * (float)bezier_basis0._7420_4_ + fVar63 * (float)bezier_basis0._8576_4_;
  auVar56._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar58 +
       fVar22 * (float)bezier_basis0._6268_4_ +
       fVar91 * (float)bezier_basis0._7424_4_ + fVar40 * (float)bezier_basis0._8580_4_;
  auVar56._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar42 +
       fVar64 * (float)bezier_basis0._6272_4_ +
       fVar44 * (float)bezier_basis0._7428_4_ + fVar41 * (float)bezier_basis0._8584_4_;
  auVar56._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar43 +
       fVar78 * (float)bezier_basis0._6276_4_ +
       fVar74 * (float)bezier_basis0._7432_4_ + fVar21 * (float)bezier_basis0._8588_4_;
  auVar56._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar57 +
       fVar90 * (float)bezier_basis0._6280_4_ +
       fVar82 * (float)bezier_basis0._7436_4_ + fVar63 * (float)bezier_basis0._8592_4_;
  auVar56._28_4_ = fVar58 + fVar22 + fVar91 + fVar40;
  auVar34 = vblendps_avx(auVar56,ZEXT432(0) << 0x20,1);
  auVar10 = vblendps_avx(auVar56,ZEXT432(0) << 0x20,0x80);
  auVar16._4_4_ = auVar34._4_4_ * 0.055555556;
  auVar16._0_4_ = auVar34._0_4_ * 0.055555556;
  auVar16._8_4_ = auVar34._8_4_ * 0.055555556;
  auVar16._12_4_ = auVar34._12_4_ * 0.055555556;
  auVar16._16_4_ = auVar34._16_4_ * 0.055555556;
  auVar16._20_4_ = auVar34._20_4_ * 0.055555556;
  auVar16._24_4_ = auVar34._24_4_ * 0.055555556;
  auVar16._28_4_ = auVar34._28_4_;
  auVar89._8_4_ = 0xff800000;
  auVar89._0_8_ = 0xff800000ff800000;
  auVar89._12_4_ = 0xff800000;
  auVar89._16_4_ = 0xff800000;
  auVar89._20_4_ = 0xff800000;
  auVar89._24_4_ = 0xff800000;
  auVar89._28_4_ = 0xff800000;
  auVar34 = vmaxps_avx(auVar89,auVar115);
  auVar16 = vsubps_avx(auVar115,auVar16);
  auVar116._0_4_ = auVar115._0_4_ + auVar10._0_4_ * 0.055555556;
  auVar116._4_4_ = auVar115._4_4_ + auVar10._4_4_ * 0.055555556;
  auVar116._8_4_ = auVar115._8_4_ + auVar10._8_4_ * 0.055555556;
  auVar116._12_4_ = auVar115._12_4_ + auVar10._12_4_ * 0.055555556;
  auVar116._16_4_ = auVar115._16_4_ + auVar10._16_4_ * 0.055555556;
  auVar116._20_4_ = auVar115._20_4_ + auVar10._20_4_ * 0.055555556;
  auVar116._24_4_ = auVar115._24_4_ + auVar10._24_4_ * 0.055555556;
  auVar116._28_4_ = auVar115._28_4_ + auVar10._28_4_;
  auVar10 = vmaxps_avx(auVar16,auVar116);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar10 = vminps_avx(auVar52,auVar54);
  auVar111._8_4_ = 0x7f800000;
  auVar111._0_8_ = 0x7f8000007f800000;
  auVar111._12_4_ = 0x7f800000;
  auVar111._16_4_ = 0x7f800000;
  auVar111._20_4_ = 0x7f800000;
  auVar111._24_4_ = 0x7f800000;
  auVar111._28_4_ = 0x7f800000;
  auVar52 = vminps_avx(auVar111,auVar105);
  auVar10 = vminps_avx(auVar52,auVar10);
  auVar52 = vminps_avx(auVar36,auVar39);
  auVar36 = vminps_avx(auVar111,auVar106);
  auVar52 = vminps_avx(auVar36,auVar52);
  auVar36 = vminps_avx(auVar111,auVar115);
  auVar16 = vminps_avx(auVar16,auVar116);
  auVar36 = vminps_avx(auVar36,auVar16);
  auVar16 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vmaxps_avx(auVar34,auVar16);
  auVar16 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar16);
  auVar25 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar15,auVar15,0xb1);
  auVar34 = vmaxps_avx(auVar15,auVar34);
  auVar15 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar15);
  auVar23 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar23 = vunpcklps_avx(auVar25,auVar23);
  auVar34 = vshufps_avx(auVar14,auVar14,0xb1);
  auVar34 = vmaxps_avx(auVar14,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar14);
  auVar25 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar25 = vinsertps_avx(auVar23,auVar25,0x28);
  auVar34 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar34 = vminps_avx(auVar36,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar14);
  auVar23 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar52,auVar52,0xb1);
  auVar34 = vminps_avx(auVar52,auVar34);
  auVar14 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar14);
  auVar26 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar26 = vunpcklps_avx(auVar23,auVar26);
  auVar34 = vshufps_avx(auVar10,auVar10,0xb1);
  auVar34 = vminps_avx(auVar10,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar23 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar23 = vinsertps_avx(auVar26,auVar23,0x28);
  auVar34 = vshufps_avx(auVar69,auVar69,0xb1);
  auVar34 = vminps_avx(auVar69,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar26 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar34 = vminps_avx(auVar35,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar27 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar27 = vunpcklps_avx(auVar26,auVar27);
  auVar34 = vshufps_avx(auVar51,auVar51,0xb1);
  auVar34 = vminps_avx(auVar51,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar10);
  auVar26 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar26 = vinsertps_avx(auVar27,auVar26,0x28);
  auVar27 = vminps_avx(auVar23,auVar26);
  auVar34 = vshufps_avx(auVar12,auVar12,0xb1);
  auVar34 = vmaxps_avx(auVar12,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar23 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar11,auVar11,0xb1);
  auVar34 = vmaxps_avx(auVar11,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar26 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar26 = vunpcklps_avx(auVar23,auVar26);
  auVar34 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar34 = vmaxps_avx(auVar33,auVar34);
  auVar10 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar10);
  auVar23 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar23 = vinsertps_avx(auVar26,auVar23,0x28);
  auVar26 = vmaxps_avx(auVar25,auVar23);
  auVar68._8_4_ = 0x7fffffff;
  auVar68._0_8_ = 0x7fffffff7fffffff;
  auVar68._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx(auVar27,auVar68);
  auVar23 = vandps_avx(auVar26,auVar68);
  auVar25 = vmaxps_avx(auVar25,auVar23);
  auVar23 = vmovshdup_avx(auVar25);
  auVar23 = vmaxss_avx(auVar23,auVar25);
  auVar25 = vshufpd_avx(auVar25,auVar25,1);
  auVar25 = vmaxss_avx(auVar25,auVar23);
  auVar25 = ZEXT416((uint)(auVar25._0_4_ * 4.7683716e-07));
  auVar25 = vshufps_avx(auVar25,auVar25,0);
  aVar13 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar27,auVar25);
  (__return_storage_ptr__->lower).field_0 = aVar13;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar26._0_4_ + auVar25._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar26._4_4_ + auVar25._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar26._8_4_ + auVar25._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar26._12_4_ + auVar25._12_4_;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }